

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_shm.c
# Opt level: O0

int test_shm(void)

{
  int iVar1;
  QcShm *qcShm;
  char *pcVar2;
  QcShm *qcShm_00;
  char *addr2;
  char *addr1;
  QcShm *qcShm2;
  QcShm *qcShm1;
  QcErr err;
  
  qcShm = qc_shm_create("test_shm_1",0xa00000,(QcErr *)&qcShm1);
  if (qcShm == (QcShm *)0x0) {
    printf("create shm failed.\n");
    err.desc[0xf8] = -1;
    err.desc[0xf9] = -1;
    err.desc[0xfa] = -1;
    err.desc[0xfb] = -1;
  }
  else {
    pcVar2 = qc_shm_getaddr(qcShm);
    strcpy(pcVar2,"123456");
    qcShm_00 = qc_shm_open("test_shm_1",(QcErr *)&qcShm1);
    if (qcShm_00 == (QcShm *)0x0) {
      printf("open shm failed.\n");
      err.desc[0xf8] = -1;
      err.desc[0xf9] = -1;
      err.desc[0xfa] = -1;
      err.desc[0xfb] = -1;
    }
    else {
      pcVar2 = qc_shm_getaddr(qcShm_00);
      iVar1 = strcmp(pcVar2,"123456");
      if (iVar1 == 0) {
        qc_shm_close(qcShm_00);
        qc_shm_destroy(qcShm);
        printf("test shm ok.\n");
        err.desc[0xf8] = '\0';
        err.desc[0xf9] = '\0';
        err.desc[0xfa] = '\0';
        err.desc[0xfb] = '\0';
      }
      else {
        printf("shm content compare failed.\n");
        err.desc[0xf8] = -1;
        err.desc[0xf9] = -1;
        err.desc[0xfa] = -1;
        err.desc[0xfb] = -1;
      }
    }
  }
  iVar1._0_1_ = err.desc[0xf8];
  iVar1._1_1_ = err.desc[0xf9];
  iVar1._2_1_ = err.desc[0xfa];
  iVar1._3_1_ = err.desc[0xfb];
  return iVar1;
}

Assistant:

int test_shm()
{
	QcErr err;
	QcShm *qcShm1;
	QcShm *qcShm2;


	qcShm1 = qc_shm_create("test_shm_1", 10 * 1024 * 1024, &err);
	if (NULL == qcShm1)
	{
		printf("create shm failed.\n");
		return -1;
	}

	char *addr1 = qc_shm_getaddr(qcShm1);
	strcpy(addr1, "123456");

	qcShm2 = qc_shm_open("test_shm_1", &err);
	if(NULL == qcShm2)
	{
		printf("open shm failed.\n");
		return -1;
	}

	char *addr2 = qc_shm_getaddr(qcShm2);

	if (0 != strcmp(addr2, "123456"))
	{
		printf("shm content compare failed.\n");
		return -1;
	}

	qc_shm_close(qcShm2);
	qc_shm_destroy(qcShm1);

	printf("test shm ok.\n");
	return 0;
}